

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O0

int GetLatestDataNMEADevice(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  double dVar4;
  int *piVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  char *pcVar10;
  double local_1a28;
  double local_1a20;
  double local_1a18;
  double local_1a10;
  double local_19d8;
  double local_19d0;
  undefined1 local_1998 [8];
  CHRONO chrono;
  int i;
  int aisbuflen;
  char aisbuf [128];
  double f2;
  double f1;
  double f0;
  char c2;
  char c1;
  char *pcStack_18a8;
  char c0;
  char *ptr_AIVDM;
  char *ptr_WIMDA;
  char *ptr_WIMWD;
  char *ptr_WIMWV;
  char *ptr_IIMWV;
  char *ptr_HCHDG;
  char *ptr_GPVTG;
  char *ptr_GPGLL;
  char *ptr_GPRMC;
  char *ptr_GPGGA;
  int local_1850;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  char savebuf [2048];
  char recvbuf [4096];
  NMEADATA *pNMEAData_local;
  NMEADEVICE *pNMEADevice_local;
  
  recvbuflen = 0;
  local_1850 = 0;
  ptr_GPGGA._4_4_ = 0;
  ptr_GPRMC = (char *)0x0;
  ptr_GPGLL = (char *)0x0;
  ptr_GPVTG = (char *)0x0;
  ptr_HCHDG = (char *)0x0;
  ptr_IIMWV = (char *)0x0;
  ptr_WIMWV = (char *)0x0;
  ptr_WIMWD = (char *)0x0;
  ptr_WIMDA = (char *)0x0;
  ptr_AIVDM = (char *)0x0;
  pcStack_18a8 = (char *)0x0;
  f0._7_1_ = 0;
  f0._6_1_ = 0;
  f0._5_1_ = 0;
  f1 = 0.0;
  f2 = 0.0;
  aisbuf[0x78] = '\0';
  aisbuf[0x79] = '\0';
  aisbuf[0x7a] = '\0';
  aisbuf[0x7b] = '\0';
  aisbuf[0x7c] = '\0';
  aisbuf[0x7d] = '\0';
  aisbuf[0x7e] = '\0';
  aisbuf[0x7f] = '\0';
  chrono._68_4_ = 0;
  chrono.Suspended = 0;
  StartChrono((CHRONO *)local_1998);
  memset(savebuf + 0x7f8,0,0x1000);
  memset(&Bytes,0,0x800);
  ptr_GPGGA._4_4_ = 0x7ff;
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)(savebuf + 0x7f8),0x7ff,&local_1850);
  if (iVar1 != 0) {
    printf("Error reading data from a NMEADevice. \n");
    return 1;
  }
  if ((pNMEADevice->bSaveRawData != 0) && (pNMEADevice->pfSaveFile != (FILE *)0x0)) {
    fwrite(savebuf + 0x7f8,(long)local_1850,1,(FILE *)pNMEADevice->pfSaveFile);
    fflush((FILE *)pNMEADevice->pfSaveFile);
  }
  recvbuflen = local_1850 + recvbuflen;
  if (ptr_GPGGA._4_4_ <= recvbuflen) {
    while (local_1850 == ptr_GPGGA._4_4_) {
      dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_1998);
      if (4.0 < dVar4) {
        printf("Error reading data from a NMEADevice : Message timeout. \n");
        return 2;
      }
      memcpy(&Bytes,savebuf + 0x7f8,(long)local_1850);
      iVar1 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)(savebuf + 0x7f8),ptr_GPGGA._4_4_,
                            &local_1850);
      if (iVar1 != 0) {
        printf("Error reading data from a NMEADevice. \n");
        return 1;
      }
      if ((pNMEADevice->bSaveRawData != 0) && (pNMEADevice->pfSaveFile != (FILE *)0x0)) {
        fwrite(savebuf + 0x7f8,(long)local_1850,1,(FILE *)pNMEADevice->pfSaveFile);
        fflush((FILE *)pNMEADevice->pfSaveFile);
      }
      recvbuflen = local_1850 + recvbuflen;
    }
    memmove(savebuf + ((long)ptr_GPGGA._4_4_ - (long)local_1850) + 0x7f8,savebuf + 0x7f8,
            (long)local_1850);
    memcpy(savebuf + 0x7f8,(void *)((long)&Bytes + (long)local_1850),
           (long)(ptr_GPGGA._4_4_ - local_1850));
    recvbuflen = ptr_GPGGA._4_4_;
  }
  if (pNMEADevice->bEnableGPGGA != 0) {
    ptr_GPRMC = FindLatestNMEASentence("$GPGGA",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableGPRMC != 0) {
    ptr_GPGLL = FindLatestNMEASentence("$GPRMC",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableGPGLL != 0) {
    ptr_GPVTG = FindLatestNMEASentence("$GPGLL",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableGPVTG != 0) {
    ptr_HCHDG = FindLatestNMEASentence("$GPVTG",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableHCHDG != 0) {
    ptr_IIMWV = FindLatestNMEASentence("$HCHDG",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableIIMWV != 0) {
    ptr_WIMWV = FindLatestNMEASentence("$IIMWV",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableWIMWV != 0) {
    ptr_WIMWD = FindLatestNMEASentence("$WIMWV",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableWIMWD != 0) {
    ptr_WIMDA = FindLatestNMEASentence("$WIMWD",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableWIMDA != 0) {
    ptr_AIVDM = FindLatestNMEASentence("$WIMDA",savebuf + 0x7f8);
  }
  if (pNMEADevice->bEnableAIVDM != 0) {
    pcStack_18a8 = FindLatestNMEASentence("!AIVDM",savebuf + 0x7f8);
  }
  while( true ) {
    if ((((((pNMEADevice->bEnableGPGGA == 0) || (bVar3 = true, ptr_GPRMC != (char *)0x0)) &&
          ((pNMEADevice->bEnableGPRMC == 0 || (bVar3 = true, ptr_GPGLL != (char *)0x0)))) &&
         ((pNMEADevice->bEnableGPGLL == 0 || (bVar3 = true, ptr_GPVTG != (char *)0x0)))) &&
        (((pNMEADevice->bEnableGPVTG == 0 || (bVar3 = true, ptr_HCHDG != (char *)0x0)) &&
         ((((pNMEADevice->bEnableHCHDG == 0 || (bVar3 = true, ptr_IIMWV != (char *)0x0)) &&
           ((pNMEADevice->bEnableIIMWV == 0 || (bVar3 = true, ptr_WIMWV != (char *)0x0)))) &&
          ((pNMEADevice->bEnableWIMWV == 0 || (bVar3 = true, ptr_WIMWD != (char *)0x0)))))))) &&
       (((pNMEADevice->bEnableWIMWD == 0 || (bVar3 = true, ptr_WIMDA != (char *)0x0)) &&
        ((pNMEADevice->bEnableWIMDA == 0 || (bVar3 = true, ptr_AIVDM != (char *)0x0)))))) {
      bVar3 = pNMEADevice->bEnableAIVDM != 0 && pcStack_18a8 == (char *)0x0;
    }
    if (!bVar3) break;
    dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_1998);
    if (4.0 < dVar4) {
      printf("Error reading data from a NMEADevice : Message timeout. \n");
      return 2;
    }
    if (0xffe < recvbuflen) {
      printf("Error reading data from a NMEADevice : Invalid data. \n");
      return 4;
    }
    iVar1 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)(savebuf + (long)recvbuflen + 0x7f8),
                          0xfff - recvbuflen,&local_1850);
    if (iVar1 != 0) {
      printf("Error reading data from a NMEADevice. \n");
      return 1;
    }
    if ((pNMEADevice->bSaveRawData != 0) && (pNMEADevice->pfSaveFile != (FILE *)0x0)) {
      fwrite(savebuf + (long)recvbuflen + 0x7f8,(long)local_1850,1,(FILE *)pNMEADevice->pfSaveFile);
      fflush((FILE *)pNMEADevice->pfSaveFile);
    }
    recvbuflen = local_1850 + recvbuflen;
    if (pNMEADevice->bEnableGPGGA != 0) {
      ptr_GPRMC = FindLatestNMEASentence("$GPGGA",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableGPRMC != 0) {
      ptr_GPGLL = FindLatestNMEASentence("$GPRMC",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableGPGLL != 0) {
      ptr_GPVTG = FindLatestNMEASentence("$GPGLL",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableGPVTG != 0) {
      ptr_HCHDG = FindLatestNMEASentence("$GPVTG",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableHCHDG != 0) {
      ptr_IIMWV = FindLatestNMEASentence("$HCHDG",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableIIMWV != 0) {
      ptr_WIMWV = FindLatestNMEASentence("$IIMWV",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableWIMWV != 0) {
      ptr_WIMWD = FindLatestNMEASentence("$WIMWV",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableWIMWD != 0) {
      ptr_WIMDA = FindLatestNMEASentence("$WIMWD",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableWIMDA != 0) {
      ptr_AIVDM = FindLatestNMEASentence("$WIMDA",savebuf + 0x7f8);
    }
    if (pNMEADevice->bEnableAIVDM != 0) {
      pcStack_18a8 = FindLatestNMEASentence("!AIVDM",savebuf + 0x7f8);
    }
  }
  memset(pNMEAData,0,0x3d8);
  if (pNMEADevice->bEnableGPGGA != 0) {
    memset(pNMEAData->szlatdeg,0,3);
    memset(pNMEAData->szlongdeg,0,4);
    pdVar9 = &pNMEAData->height_geoid;
    iVar1 = __isoc99_sscanf(ptr_GPRMC,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M",
                            pNMEAData,pNMEAData->szlatdeg,pNMEAData->szlatdeg + 1,&pNMEAData->latmin
                            ,&pNMEAData->north,pNMEAData->szlongdeg,pNMEAData->szlongdeg + 1,
                            pNMEAData->szlongdeg + 2,&pNMEAData->longmin,&pNMEAData->east,
                            &pNMEAData->GPS_quality_indicator,&pNMEAData->nbsat,&pNMEAData->hdop,
                            &pNMEAData->Altitude,pdVar9);
    if (iVar1 != 0xf) {
      piVar5 = &pNMEAData->nbsat;
      pdVar7 = &pNMEAData->hdop;
      pdVar8 = &pNMEAData->Altitude;
      iVar1 = __isoc99_sscanf(ptr_GPRMC,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M",
                              pNMEAData,pNMEAData->szlatdeg,pNMEAData->szlatdeg + 1,
                              &pNMEAData->latmin,&pNMEAData->north,pNMEAData->szlongdeg,
                              pNMEAData->szlongdeg + 1,pNMEAData->szlongdeg + 2,&pNMEAData->longmin,
                              &pNMEAData->east,&pNMEAData->GPS_quality_indicator,piVar5,pdVar7,
                              pdVar8,pdVar9);
      if ((((iVar1 != 0xe) &&
           (iVar1 = __isoc99_sscanf(ptr_GPRMC,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d",pNMEAData,
                                    pNMEAData->szlatdeg,pNMEAData->szlatdeg + 1,&pNMEAData->latmin,
                                    &pNMEAData->north,pNMEAData->szlongdeg,pNMEAData->szlongdeg + 1,
                                    pNMEAData->szlongdeg + 2,&pNMEAData->longmin,&pNMEAData->east,
                                    &pNMEAData->GPS_quality_indicator,piVar5,pdVar7,pdVar8,pdVar9),
           iVar1 != 0xb)) &&
          (iVar1 = __isoc99_sscanf(ptr_GPRMC,"$GPGGA,%lf,,,,,%d",pNMEAData,
                                   &pNMEAData->GPS_quality_indicator), iVar1 != 2)) &&
         (iVar1 = __isoc99_sscanf(ptr_GPRMC,"$GPGGA,,,,,,%d",&pNMEAData->GPS_quality_indicator),
         iVar1 != 1)) {
        printf("Error reading data from a NMEADevice : Invalid data. \n");
        return 1;
      }
    }
    if (0.0 < pNMEAData->utc) {
      pNMEAData->hour = (int)pNMEAData->utc / 10000;
      pNMEAData->minute = (int)pNMEAData->utc / 100 + pNMEAData->hour * -100;
      pNMEAData->second =
           (pNMEAData->utc - (double)(pNMEAData->hour * 10000)) - (double)(pNMEAData->minute * 100);
    }
    sVar2 = strlen(pNMEAData->szlatdeg);
    if ((sVar2 != 0) && (sVar2 = strlen(pNMEAData->szlongdeg), sVar2 != 0)) {
      iVar1 = atoi(pNMEAData->szlatdeg);
      pNMEAData->latdeg = iVar1;
      iVar1 = atoi(pNMEAData->szlongdeg);
      pNMEAData->longdeg = iVar1;
      if (pNMEAData->north == 'N') {
        local_19d0 = (double)pNMEAData->latdeg + pNMEAData->latmin / 60.0;
      }
      else {
        local_19d0 = -((double)pNMEAData->latdeg + pNMEAData->latmin / 60.0);
      }
      pNMEAData->Latitude = local_19d0;
      if (pNMEAData->east == 'E') {
        local_19d8 = (double)pNMEAData->longdeg + pNMEAData->longmin / 60.0;
      }
      else {
        local_19d8 = -((double)pNMEAData->longdeg + pNMEAData->longmin / 60.0);
      }
      pNMEAData->Longitude = local_19d8;
    }
  }
  if (pNMEADevice->bEnableGPRMC != 0) {
    memset(pNMEAData->szlatdeg,0,3);
    memset(pNMEAData->szlongdeg,0,4);
    pdVar9 = &pNMEAData->variation;
    pcVar10 = &pNMEAData->var_east;
    iVar1 = __isoc99_sscanf(ptr_GPGLL,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c",
                            pNMEAData,&pNMEAData->status,pNMEAData->szlatdeg,pNMEAData->szlatdeg + 1
                            ,&pNMEAData->latmin,&pNMEAData->north,pNMEAData->szlongdeg,
                            pNMEAData->szlongdeg + 1,pNMEAData->szlongdeg + 2,&pNMEAData->longmin,
                            &pNMEAData->east,&pNMEAData->sog,&pNMEAData->cog,&pNMEAData->date,pdVar9
                            ,pcVar10);
    if (iVar1 != 0x10) {
      pdVar6 = &pNMEAData->sog;
      pdVar7 = &pNMEAData->cog;
      pdVar8 = &pNMEAData->date;
      iVar1 = __isoc99_sscanf(ptr_GPGLL,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf",
                              pNMEAData,&pNMEAData->status,pNMEAData->szlatdeg,
                              pNMEAData->szlatdeg + 1,&pNMEAData->latmin,&pNMEAData->north,
                              pNMEAData->szlongdeg,pNMEAData->szlongdeg + 1,pNMEAData->szlongdeg + 2
                              ,&pNMEAData->longmin,&pNMEAData->east,pdVar6,pdVar7,pdVar8,pdVar9,
                              pcVar10);
      if (((iVar1 != 0xe) &&
          (iVar1 = __isoc99_sscanf(ptr_GPGLL,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c",pNMEAData,
                                   &pNMEAData->status,pNMEAData->szlatdeg,pNMEAData->szlatdeg + 1,
                                   &pNMEAData->latmin,&pNMEAData->north,pNMEAData->szlongdeg,
                                   pNMEAData->szlongdeg + 1,pNMEAData->szlongdeg + 2,
                                   &pNMEAData->longmin,&pNMEAData->east,pdVar6,pdVar7,pdVar8,pdVar9,
                                   pcVar10), iVar1 != 0xb)) &&
         ((iVar1 = __isoc99_sscanf(ptr_GPGLL,"$GPRMC,%lf,%c",pNMEAData,&pNMEAData->status),
          iVar1 != 2 &&
          (iVar1 = __isoc99_sscanf(ptr_GPGLL,"$GPRMC,,%c",&pNMEAData->status), iVar1 != 1)))) {
        printf("Error reading data from a NMEADevice : Invalid data. \n");
        return 1;
      }
    }
    if (0.0 < pNMEAData->utc) {
      pNMEAData->hour = (int)pNMEAData->utc / 10000;
      pNMEAData->minute = (int)pNMEAData->utc / 100 + pNMEAData->hour * -100;
      pNMEAData->second =
           (pNMEAData->utc - (double)(pNMEAData->hour * 10000)) - (double)(pNMEAData->minute * 100);
    }
    sVar2 = strlen(pNMEAData->szlatdeg);
    if ((sVar2 != 0) && (sVar2 = strlen(pNMEAData->szlongdeg), sVar2 != 0)) {
      iVar1 = atoi(pNMEAData->szlatdeg);
      pNMEAData->latdeg = iVar1;
      iVar1 = atoi(pNMEAData->szlongdeg);
      pNMEAData->longdeg = iVar1;
      if (pNMEAData->north == 'N') {
        local_1a10 = (double)pNMEAData->latdeg + pNMEAData->latmin / 60.0;
      }
      else {
        local_1a10 = -((double)pNMEAData->latdeg + pNMEAData->latmin / 60.0);
      }
      pNMEAData->Latitude = local_1a10;
      if (pNMEAData->east == 'E') {
        local_1a18 = (double)pNMEAData->longdeg + pNMEAData->longmin / 60.0;
      }
      else {
        local_1a18 = -((double)pNMEAData->longdeg + pNMEAData->longmin / 60.0);
      }
      pNMEAData->Longitude = local_1a18;
    }
    pNMEAData->SOG = pNMEAData->sog / 1.94;
    pNMEAData->COG = (pNMEAData->cog * 3.141592653589793) / 180.0;
    if (0.0 < pNMEAData->date) {
      pNMEAData->day = (int)pNMEAData->date / 10000;
      pNMEAData->month = (int)pNMEAData->date / 100 + pNMEAData->day * -100;
      pNMEAData->year =
           (int)pNMEAData->date + pNMEAData->day * -10000 + 2000 + pNMEAData->month * -100;
    }
  }
  if (pNMEADevice->bEnableGPGLL != 0) {
    memset(pNMEAData->szlatdeg,0,3);
    memset(pNMEAData->szlongdeg,0,4);
    iVar1 = __isoc99_sscanf(ptr_GPVTG,"$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c",pNMEAData->szlatdeg,
                            pNMEAData->szlatdeg + 1,&pNMEAData->latmin,&pNMEAData->north,
                            pNMEAData->szlongdeg,pNMEAData->szlongdeg + 1,pNMEAData->szlongdeg + 2,
                            &pNMEAData->longmin,&pNMEAData->east,pNMEAData,&pNMEAData->status);
    if (((iVar1 != 0xb) &&
        (iVar1 = __isoc99_sscanf(ptr_GPVTG,"$GPGLL,,,,,%lf,%c",pNMEAData,&pNMEAData->status),
        iVar1 != 2)) &&
       (iVar1 = __isoc99_sscanf(ptr_GPVTG,"$GPGLL,,,,,,%c",&pNMEAData->status), iVar1 != 1)) {
      printf("Error reading data from a NMEADevice : Invalid data. \n");
      return 1;
    }
    sVar2 = strlen(pNMEAData->szlatdeg);
    if ((sVar2 != 0) && (sVar2 = strlen(pNMEAData->szlongdeg), sVar2 != 0)) {
      iVar1 = atoi(pNMEAData->szlatdeg);
      pNMEAData->latdeg = iVar1;
      iVar1 = atoi(pNMEAData->szlongdeg);
      pNMEAData->longdeg = iVar1;
      if (pNMEAData->north == 'N') {
        local_1a20 = (double)pNMEAData->latdeg + pNMEAData->latmin / 60.0;
      }
      else {
        local_1a20 = -((double)pNMEAData->latdeg + pNMEAData->latmin / 60.0);
      }
      pNMEAData->Latitude = local_1a20;
      if (pNMEAData->east == 'E') {
        local_1a28 = (double)pNMEAData->longdeg + pNMEAData->longmin / 60.0;
      }
      else {
        local_1a28 = -((double)pNMEAData->longdeg + pNMEAData->longmin / 60.0);
      }
      pNMEAData->Longitude = local_1a28;
    }
    if (0.0 < pNMEAData->utc) {
      pNMEAData->hour = (int)pNMEAData->utc / 10000;
      pNMEAData->minute = (int)pNMEAData->utc / 100 + pNMEAData->hour * -100;
      pNMEAData->second =
           (pNMEAData->utc - (double)(pNMEAData->hour * 10000)) - (double)(pNMEAData->minute * 100);
    }
  }
  if (pNMEADevice->bEnableGPVTG != 0) {
    iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,%lf,T,%lf,M,%lf,N",&pNMEAData->cog,&pNMEAData->mag_cog
                            ,&pNMEAData->sog);
    if ((((iVar1 != 3) &&
         (iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,%lf,T,,M,%lf,N",&pNMEAData->cog,&pNMEAData->sog)
         , iVar1 != 2)) &&
        ((iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,%lf,T,,,%lf,N",&pNMEAData->cog,&pNMEAData->sog),
         iVar1 != 2 &&
         (((iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,nan,T,nan,M,%lf,N",&pNMEAData->sog),
           iVar1 != 1 &&
           (iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,NAN,T,NAN,M,%lf,N",&pNMEAData->sog),
           iVar1 != 1)) &&
          (iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,NaN,T,NaN,M,%lf,N",&pNMEAData->sog), iVar1 != 1
          )))))) &&
       ((iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,nan,T,,,%lf,N",&pNMEAData->sog), iVar1 != 1 &&
        (iVar1 = __isoc99_sscanf(ptr_HCHDG,"$GPVTG,NAN,T,,,%lf,N",&pNMEAData->sog), iVar1 != 1)))) {
      __isoc99_sscanf(ptr_HCHDG,"$GPVTG,NaN,T,,,%lf,N",&pNMEAData->sog);
    }
    pNMEAData->SOG = pNMEAData->sog / 1.94;
    pNMEAData->COG = (pNMEAData->cog * 3.141592653589793) / 180.0;
  }
  if (pNMEADevice->bEnableHCHDG != 0) {
    __isoc99_sscanf(ptr_IIMWV,"$HCHDG,%lf,%lf,%c,%lf,%c",&pNMEAData->heading,&pNMEAData->deviation,
                    &pNMEAData->dev_east,&pNMEAData->variation,&pNMEAData->var_east);
    pNMEAData->Heading = (pNMEAData->heading * 3.141592653589793) / 180.0;
  }
  if (pNMEADevice->bEnableIIMWV != 0) {
    iVar1 = __isoc99_sscanf(ptr_WIMWV,"$IIMWV,%lf,R,%lf,%c,A",&pNMEAData->awinddir,
                            &pNMEAData->awindspeed,&pNMEAData->cawindspeed);
    if (iVar1 != 3) {
      printf("Error reading data from a NMEADevice : Invalid data. \n");
      return 1;
    }
    pNMEAData->ApparentWindDir = (pNMEAData->awinddir * 3.141592653589793) / 180.0;
    switch(pNMEAData->cawindspeed) {
    case 'K':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.28;
      break;
    default:
      break;
    case 'M':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed;
      break;
    case 'N':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.51;
      break;
    case 'S':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.45;
    }
  }
  if (pNMEADevice->bEnableWIMWV != 0) {
    iVar1 = __isoc99_sscanf(ptr_WIMWD,"$WIMWV,%lf,R,%lf,%c,A",&pNMEAData->awinddir,
                            &pNMEAData->awindspeed,&pNMEAData->cawindspeed);
    if (iVar1 != 3) {
      printf("Error reading data from a NMEADevice : Invalid data. \n");
      return 1;
    }
    pNMEAData->ApparentWindDir = (pNMEAData->awinddir * 3.141592653589793) / 180.0;
    switch(pNMEAData->cawindspeed) {
    case 'K':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.28;
      break;
    default:
      break;
    case 'M':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed;
      break;
    case 'N':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.51;
      break;
    case 'S':
      pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed * 0.45;
    }
  }
  if (pNMEADevice->bEnableWIMWD != 0) {
    __isoc99_sscanf(ptr_WIMDA,"$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&pNMEAData->winddir,
                    &pNMEAData->cwinddir,&f2,(long)&f0 + 6,aisbuf + 0x78,(long)&f0 + 5,
                    &pNMEAData->windspeed,&pNMEAData->cwindspeed);
    pNMEAData->WindDir = (pNMEAData->winddir * 3.141592653589793) / 180.0;
    pNMEAData->WindSpeed = pNMEAData->windspeed;
  }
  if (pNMEADevice->bEnableWIMDA != 0) {
    __isoc99_sscanf(ptr_AIVDM,"$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&f1,
                    (long)&f0 + 7,&pNMEAData->pressure,&pNMEAData->cpressure,&pNMEAData->temperature
                    ,&pNMEAData->ctemperature,&pNMEAData->winddir,&pNMEAData->cwinddir,&f2,
                    (long)&f0 + 6,aisbuf + 0x78,(long)&f0 + 5,&pNMEAData->windspeed,
                    &pNMEAData->cwindspeed);
    pNMEAData->WindDir = (pNMEAData->winddir * 3.141592653589793) / 180.0;
    pNMEAData->WindSpeed = pNMEAData->windspeed;
  }
  if (pNMEADevice->bEnableAIVDM != 0) {
    memset(&i,0,0x80);
    __isoc99_sscanf(pcStack_18a8,"!AIVDM,%d,%d,,%c,%127s",&pNMEAData->nbsentences,
                    &pNMEAData->sentence_number,&pNMEAData->AIS_channel,&i);
    if ((pNMEAData->nbsentences == 1) && (pNMEAData->sentence_number == 1)) {
      chrono.Suspended = 0;
      while( true ) {
        bVar3 = false;
        if (chrono.Suspended < 0x7f) {
          bVar3 = *(char *)((long)&i + (long)chrono.Suspended) != '\0';
        }
        if (!bVar3) goto LAB_0016a23b;
        iVar1 = __isoc99_sscanf((long)&i + (long)chrono.Suspended,",%d",&pNMEAData->nbfillbits);
        if (iVar1 == 1) break;
        chrono.Suspended = chrono.Suspended + 1;
      }
      chrono._68_4_ = chrono.Suspended;
      memset((void *)((long)&i + (long)chrono.Suspended),0,0x80 - (long)chrono.Suspended);
LAB_0016a23b:
      if (chrono._68_4_ != 0) {
        decode_AIS((char *)&i,chrono._68_4_,&pNMEAData->AIS_Latitude,&pNMEAData->AIS_Longitude,
                   &pNMEAData->AIS_SOG,&pNMEAData->AIS_COG);
      }
    }
  }
  memcpy(&pNMEADevice->LastNMEAData,pNMEAData,0x3d8);
  return 0;
}

Assistant:

inline int GetLatestDataNMEADevice(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	char recvbuf[2*MAX_NB_BYTES_NMEADEVICE];
	char savebuf[MAX_NB_BYTES_NMEADEVICE];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_GPGGA = NULL;
	char* ptr_GPRMC = NULL;
	char* ptr_GPGLL = NULL;
	char* ptr_GPVTG = NULL;
	char* ptr_HCHDG = NULL;
	char* ptr_IIMWV = NULL;
	char* ptr_WIMWV = NULL;
	char* ptr_WIMWD = NULL;
	char* ptr_WIMDA = NULL;
	char* ptr_AIVDM = NULL;
	// Temporary buffers for sscanf().
	char c0 = 0, c1 = 0, c2 = 0;
	double f0 = 0, f1 = 0, f2 = 0;
	char aisbuf[128];
	int aisbuflen = 0;
	int i = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_NMEADEVICE-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a NMEADevice. \n");
		return EXIT_FAILURE;
	}
	if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
		fflush(pNMEADevice->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
			{
				printf("Error reading data from a NMEADevice : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a NMEADevice. \n");
				return EXIT_FAILURE;
			}
			if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
				fflush(pNMEADevice->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
	if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
	if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
	if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
	if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
	if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
	if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
	if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);

	while (
		(pNMEADevice->bEnableGPGGA&&!ptr_GPGGA)||
		(pNMEADevice->bEnableGPRMC&&!ptr_GPRMC)||
		(pNMEADevice->bEnableGPGLL&&!ptr_GPGLL)||
		(pNMEADevice->bEnableGPVTG&&!ptr_GPVTG)||
		(pNMEADevice->bEnableHCHDG&&!ptr_HCHDG)||
		(pNMEADevice->bEnableIIMWV&&!ptr_IIMWV)||
		(pNMEADevice->bEnableWIMWV&&!ptr_WIMWV)||
		(pNMEADevice->bEnableWIMWD&&!ptr_WIMWD)||
		(pNMEADevice->bEnableWIMDA&&!ptr_WIMDA)||
		(pNMEADevice->bEnableAIVDM&&!ptr_AIVDM)
		)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
		{
			printf("Error reading data from a NMEADevice : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_NMEADEVICE-1)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_NMEADEVICE-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a NMEADevice. \n");
			return EXIT_FAILURE;
		}
		if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pNMEADevice->pfSaveFile);
			fflush(pNMEADevice->pfSaveFile);
		}
		BytesReceived += Bytes;
		if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
		if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
		if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
		if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
		if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
		if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
		if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
		if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);
	}

	// Analyze data.

	memset(pNMEAData, 0, sizeof(NMEADATA));

	// GPS essential fix data.
	if (pNMEADevice->bEnableGPGGA)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude, &pNMEAData->height_geoid) != 15)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude) != 14)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator) != 11)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,,,,,%d", &pNMEAData->utc, &pNMEAData->GPS_quality_indicator) != 2)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,,,,,,%d", &pNMEAData->GPS_quality_indicator) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}
	}

	// GPS recommended minimum data.
	if (pNMEADevice->bEnableGPRMC)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date, &pNMEAData->variation, &pNMEAData->var_east) != 16)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date) != 14)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east) != 11)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,,%c", &pNMEAData->status) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;

		if (pNMEAData->date > 0)
		{
			pNMEAData->day = (int)pNMEAData->date/10000;
			pNMEAData->month = (int)pNMEAData->date/100-pNMEAData->day*100;
			pNMEAData->year = 2000+((int)pNMEAData->date-pNMEAData->day*10000)-pNMEAData->month*100;
		}
	}

	// GPS position, latitude / longitude and time.
	if (pNMEADevice->bEnableGPGLL)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if ((sscanf(ptr_GPGLL, "$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c", 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east, 
			&pNMEAData->utc, &pNMEAData->status) != 11)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,,%c", &pNMEAData->status) != 1))
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}
	}

	// GPS COG and SOG.
	if (pNMEADevice->bEnableGPVTG)
	{
		if ((sscanf(ptr_GPVTG, "$GPVTG,%lf,T,%lf,M,%lf,N", &pNMEAData->cog, &pNMEAData->mag_cog, &pNMEAData->sog) != 3)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,M,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,nan,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,NAN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,NaN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,,,%lf,N", &pNMEAData->sog) != 1))
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;
	}

	// Heading data.
	if (pNMEADevice->bEnableHCHDG)
	{
		if (sscanf(ptr_HCHDG, "$HCHDG,%lf,%lf,%c,%lf,%c", 
			&pNMEAData->heading, &pNMEAData->deviation, &pNMEAData->dev_east, &pNMEAData->variation, &pNMEAData->var_east) != 5)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert heading to angle in rad.
		pNMEAData->Heading = pNMEAData->heading*M_PI/180.0;
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableIIMWV)
	{
		if (sscanf(ptr_IIMWV, "$IIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableWIMWV)
	{
		if (sscanf(ptr_WIMWV, "$WIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind direction and speed, with respect to north.
	if (pNMEADevice->bEnableWIMWD)
	{
		if (sscanf(ptr_WIMWD, "$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 8)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// Meteorological composite data.
	if (pNMEADevice->bEnableWIMDA)
	{
		if (sscanf(ptr_WIMDA, "$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&f0, &c0, &pNMEAData->pressure, &pNMEAData->cpressure, &pNMEAData->temperature, &pNMEAData->ctemperature,  
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 14)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// AIS data.
	if (pNMEADevice->bEnableAIVDM)
	{
		memset(aisbuf, 0, sizeof(aisbuf));
		if (sscanf(ptr_AIVDM, "!AIVDM,%d,%d,,%c,%127s", 
			&pNMEAData->nbsentences, &pNMEAData->sentence_number, &pNMEAData->AIS_channel, aisbuf) != 4)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Only the most simple AIS messages are handled...
		if ((pNMEAData->nbsentences == 1)&&(pNMEAData->sentence_number == 1))
		{
			i = 0;
			// Search for the end of the AIS data payload.
			while ((i < (int)sizeof(aisbuf)-1)&&(aisbuf[i] != 0))
			{
				if (sscanf(aisbuf+i, ",%d", &pNMEAData->nbfillbits) == 1) 
				{
					aisbuflen = i;
					// Fill with 0 the rest of the buffer to keep only the AIS data payload in aisbuf.
					memset(aisbuf+i, 0, sizeof(aisbuf)-i);
					break;
				}
				i++;
			}
			if (aisbuflen != 0)
			{
				// Temporary...
#if defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
				decode_AIS(aisbuf, aisbuflen, &pNMEAData->AIS_Latitude, &pNMEAData->AIS_Longitude, &pNMEAData->AIS_SOG, &pNMEAData->AIS_COG);
#endif // defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
			}
			else
			{
				//printf("Error reading data from a NMEADevice : Invalid data. \n");
				//return EXIT_FAILURE;
			}
		}
		else
		{
			// Unhandled...
		}
	}

	pNMEADevice->LastNMEAData = *pNMEAData;

	return EXIT_SUCCESS;
}